

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void variance_double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  double absolute_tolerance;
  double *in_stack_fffffffffffffd38;
  double local_2b0;
  value_type local_2a8;
  value_type local_2a0;
  double local_290;
  value_type local_288;
  value_type local_280;
  double local_270;
  value_type local_268;
  value_type local_260;
  double local_250;
  value_type local_248;
  value_type local_240;
  double local_230;
  value_type local_228;
  value_type local_220;
  double local_210;
  value_type local_208;
  value_type local_200;
  double local_1f0;
  value_type local_1e8;
  value_type local_1e0;
  double local_1d0;
  value_type local_1c8;
  value_type local_1c0;
  double local_1b0;
  value_type local_1a8;
  value_type local_1a0;
  double local_190;
  value_type local_188;
  value_type local_180;
  double local_170;
  value_type local_168;
  value_type local_160;
  double local_150;
  value_type local_148;
  value_type local_140;
  double local_130;
  value_type local_128;
  value_type local_120;
  double local_110;
  value_type local_108;
  value_type local_100;
  double local_f0;
  value_type local_e8;
  value_type local_e0;
  double local_d0;
  value_type local_c8;
  value_type local_c0;
  double local_b0;
  value_type local_a8;
  value_type local_a0;
  double local_90;
  value_type local_88;
  value_type local_80;
  double local_70;
  value_type local_68 [4];
  undefined1 local_48 [8];
  moment_variance<double> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum,0.0001,absolute_tolerance);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::basic_moment
            ((basic_moment<double,_(trial::online::with)2> *)local_48,0.125,0.25);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,1.0);
  local_68[2] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_68[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x1a4,"void variance_double_suite::test_exponential_increase()",local_68 + 2,
             local_68 + 1);
  local_68[0] = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                          ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_70 = 0.0;
  local_80 = filter.sum.variance;
  predicate_17.absolute = tolerance.relative;
  predicate_17.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1a5,0x111a07,(char *)local_68,&local_70,in_stack_fffffffffffffd38,
             predicate_17);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,10.0);
  local_88 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_90 = 5.8;
  local_a0 = filter.sum.variance;
  predicate_16.absolute = tolerance.relative;
  predicate_16.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1a7,0x111a07,(char *)&local_88,&local_90,in_stack_fffffffffffffd38,
             predicate_16);
  local_a8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_b0 = 10.08;
  local_c0 = filter.sum.variance;
  predicate_15.absolute = tolerance.relative;
  predicate_15.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","10.08","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1a8,0x111a07,(char *)&local_a8,&local_b0,in_stack_fffffffffffffd38,
             predicate_15);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,100.0);
  local_c8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                       ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_d0 = 41.4734;
  local_e0 = filter.sum.variance;
  predicate_14.absolute = tolerance.relative;
  predicate_14.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","41.4734","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1aa,0x111a07,(char *)&local_c8,&local_d0,in_stack_fffffffffffffd38,
             predicate_14);
  local_e8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                       ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_f0 = 1486.96;
  local_100 = filter.sum.variance;
  predicate_13.absolute = tolerance.relative;
  predicate_13.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1486.96","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ab,0x111a07,(char *)&local_e8,&local_f0,in_stack_fffffffffffffd38,
             predicate_13);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,1000.0);
  local_108 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_110 = 331.01;
  local_120 = filter.sum.variance;
  predicate_12.absolute = tolerance.relative;
  predicate_12.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","331.01","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ad,0x111a07,(char *)&local_108,&local_110,in_stack_fffffffffffffd38,
             predicate_12);
  local_128 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_130 = 164617.0;
  local_140 = filter.sum.variance;
  predicate_11.absolute = tolerance.relative;
  predicate_11.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","164617.","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ae,0x111a07,(char *)&local_128,&local_130,in_stack_fffffffffffffd38,
             predicate_11);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,10000.0);
  local_148 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_150 = 2812.32;
  local_160 = filter.sum.variance;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2812.32","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b0,0x111a07,(char *)&local_148,&local_150,in_stack_fffffffffffffd38,
             predicate_10);
  local_168 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_170 = 17044900.0;
  local_180 = filter.sum.variance;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.70449e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b1,0x111a07,(char *)&local_168,&local_170,in_stack_fffffffffffffd38,
             predicate_09);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,100000.0);
  local_188 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_190 = 24852.2;
  local_1a0 = filter.sum.variance;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","24852.2","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b3,0x111a07,(char *)&local_188,&local_190,in_stack_fffffffffffffd38,
             predicate_08);
  local_1a8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_1b0 = 1729330000.0;
  local_1c0 = filter.sum.variance;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.72933e9","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b4,0x111a07,(char *)&local_1a8,&local_1b0,in_stack_fffffffffffffd38,
             predicate_07);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,1000000.0);
  local_1c8 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_1d0 = 225565.0;
  local_1e0 = filter.sum.variance;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","225565.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b6,0x111a07,(char *)&local_1c8,&local_1d0,in_stack_fffffffffffffd38,
             predicate_06);
  local_1e8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_1f0 = 174265000000.0;
  local_200 = filter.sum.variance;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.74265e11","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b7,0x111a07,(char *)&local_1e8,&local_1f0,in_stack_fffffffffffffd38,
             predicate_05);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,10000000.0);
  local_208 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_210 = 2086960.0;
  local_220 = filter.sum.variance;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.08696e6","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1b9,0x111a07,(char *)&local_208,&local_210,in_stack_fffffffffffffd38,
             predicate_04);
  local_228 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_230 = 17521400000000.0;
  local_240 = filter.sum.variance;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.75214e13","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1ba,0x111a07,(char *)&local_228,&local_230,in_stack_fffffffffffffd38,
             predicate_03);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,100000000.0);
  local_248 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_250 = 19587900.0;
  local_260 = filter.sum.variance;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.95879e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1bc,0x111a07,(char *)&local_248,&local_250,in_stack_fffffffffffffd38,
             predicate_02);
  local_268 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_270 = 1.76054e+15;
  local_280 = filter.sum.variance;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76054e15","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1bd,0x111a07,(char *)&local_268,&local_270,in_stack_fffffffffffffd38,
             predicate_01);
  trial::online::decay::basic_moment<double,_(trial::online::with)2>::push
            ((basic_moment<double,_(trial::online::with)2> *)local_48,1000000000.0);
  local_288 = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                        ((basic_moment<double,_(trial::online::with)1> *)local_48);
  local_290 = 185889000.0;
  local_2a0 = filter.sum.variance;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.85889e8","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1bf,0x111a07,(char *)&local_288,&local_290,in_stack_fffffffffffffd38,
             predicate_00);
  local_2a8 = trial::online::decay::basic_moment<double,_(trial::online::with)2>::variance
                        ((basic_moment<double,_(trial::online::with)2> *)local_48);
  local_2b0 = 1.76876e+17;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.76876e17","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,(char *)0x1c0,0x111a07,(char *)&local_2a8,&local_2b0,in_stack_fffffffffffffd38,
             predicate);
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-4);
    decay::moment_variance<double> filter(one_over_eight, one_over_four);
    filter.push(1e0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_WITH(filter.variance(), 0.0, tolerance);
    filter.push(1e1);
    TRIAL_TEST_WITH(filter.mean(), 5.8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 10.08, tolerance);
    filter.push(1e2);
    TRIAL_TEST_WITH(filter.mean(), 41.4734, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1486.96, tolerance);
    filter.push(1e3);
    TRIAL_TEST_WITH(filter.mean(), 331.01, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 164617., tolerance);
    filter.push(1e4);
    TRIAL_TEST_WITH(filter.mean(), 2812.32, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.70449e7, tolerance);
    filter.push(1e5);
    TRIAL_TEST_WITH(filter.mean(), 24852.2, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.72933e9, tolerance);
    filter.push(1e6);
    TRIAL_TEST_WITH(filter.mean(), 225565.0, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.74265e11, tolerance);
    filter.push(1e7);
    TRIAL_TEST_WITH(filter.mean(), 2.08696e6, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.75214e13, tolerance);
    filter.push(1e8);
    TRIAL_TEST_WITH(filter.mean(), 1.95879e7, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76054e15, tolerance);
    filter.push(1e9);
    TRIAL_TEST_WITH(filter.mean(), 1.85889e8, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 1.76876e17, tolerance);
}